

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O0

void __thiscall pmx::PmxSetting::Read(PmxSetting *this,istream *stream)

{
  DeadlyImportError *this_00;
  int local_5c;
  undefined1 local_56;
  undefined1 local_55;
  int i;
  uint8_t temp;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  istream *piStack_18;
  uint8_t count;
  istream *stream_local;
  PmxSetting *this_local;
  
  piStack_18 = stream;
  stream_local = (istream *)this;
  std::istream::read((char *)stream,(long)&local_19);
  if (local_19 < 8) {
    local_55 = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"MMD: invalid size",&local_41);
    DeadlyImportError::DeadlyImportError(this_00,&local_40);
    local_55 = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::istream::read((char *)piStack_18,(long)this);
  std::istream::read((char *)piStack_18,(long)&this->uv);
  std::istream::read((char *)piStack_18,(long)&this->vertex_index_size);
  std::istream::read((char *)piStack_18,(long)&this->texture_index_size);
  std::istream::read((char *)piStack_18,(long)&this->material_index_size);
  std::istream::read((char *)piStack_18,(long)&this->bone_index_size);
  std::istream::read((char *)piStack_18,(long)&this->morph_index_size);
  std::istream::read((char *)piStack_18,(long)&this->rigidbody_index_size);
  for (local_5c = 8; local_5c < (int)(uint)local_19; local_5c = local_5c + 1) {
    std::istream::read((char *)piStack_18,(long)&local_56);
  }
  return;
}

Assistant:

void PmxSetting::Read(std::istream *stream)
	{
		uint8_t count;
		stream->read((char*) &count, sizeof(uint8_t));
		if (count < 8)
		{
			throw DeadlyImportError("MMD: invalid size");
		}
		stream->read((char*) &encoding, sizeof(uint8_t));
		stream->read((char*) &uv, sizeof(uint8_t));
		stream->read((char*) &vertex_index_size, sizeof(uint8_t));
		stream->read((char*) &texture_index_size, sizeof(uint8_t));
		stream->read((char*) &material_index_size, sizeof(uint8_t));
		stream->read((char*) &bone_index_size, sizeof(uint8_t));
		stream->read((char*) &morph_index_size, sizeof(uint8_t));
		stream->read((char*) &rigidbody_index_size, sizeof(uint8_t));
		uint8_t temp;
		for (int i = 8; i < count; i++)
		{
			stream->read((char*)&temp, sizeof(uint8_t));
		}
	}